

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsimg.cpp
# Opt level: O2

void __thiscall CTcParser::build_grammar_productions(CTcParser *this)

{
  CTcGramProdEntry *prod;
  CTcGramProdEntry **ppCVar1;
  
  CTcPrsSymtab::enum_entries(this->global_symtab_,build_grammar_cb,this);
  ppCVar1 = &this->gramprod_head_;
  while (prod = *ppCVar1, prod != (CTcGramProdEntry *)0x0) {
    CTcGenTarg::gen_code_for_gramprod(G_cg,prod);
    ppCVar1 = &prod->nxt_;
  }
  return;
}

Assistant:

void CTcParser::build_grammar_productions()
{
    CTcGramProdEntry *entry;

    /* 
     *   First, run through the symbol table and merge all of the private
     *   grammar rules into the master grammar rule list.  Since we've
     *   finished linking, we've already applied all modify/replace
     *   overrides, hence each symbol table entry referring to an object
     *   will contain its final private grammar rule list.  So, we can
     *   safely merge the private lists into the master lists at this point,
     *   since no more modifications to private lists are possible.  
     */
    get_global_symtab()->enum_entries(&build_grammar_cb, this);

    /* 
     *   iterate over the master list of productions and generate the image
     *   data for each one 
     */
    for (entry = gramprod_head_ ; entry != 0 ; entry = entry->get_next())
    {
        /* build this entry */
        G_cg->gen_code_for_gramprod(entry);
    }
}